

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

void av1_crc32c_calculator_init(CRC32C *p_crc32c)

{
  int n;
  ulong uVar1;
  long lVar2;
  uint32_t *puVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  
  for (uVar1 = 0; uVar1 != 0x100; uVar1 = uVar1 + 1) {
    uVar5 = uVar1 >> 1 & 0x7fffffff;
    uVar6 = (ulong)((uint)uVar5 ^ 0x82f63b78);
    if ((uVar1 & 1) == 0) {
      uVar6 = uVar5;
    }
    uVar5 = (ulong)((uint)(uVar6 >> 1) ^ 0x82f63b78);
    if ((uVar6 & 1) == 0) {
      uVar5 = uVar6 >> 1;
    }
    uVar6 = (ulong)((uint)(uVar5 >> 1) ^ 0x82f63b78);
    if ((uVar5 & 1) == 0) {
      uVar6 = uVar5 >> 1;
    }
    uVar5 = (ulong)((uint)(uVar6 >> 1) ^ 0x82f63b78);
    if ((uVar6 & 1) == 0) {
      uVar5 = uVar6 >> 1;
    }
    uVar6 = (ulong)((uint)(uVar5 >> 1) ^ 0x82f63b78);
    if ((uVar5 & 1) == 0) {
      uVar6 = uVar5 >> 1;
    }
    uVar5 = (ulong)((uint)(uVar6 >> 1) ^ 0x82f63b78);
    if ((uVar6 & 1) == 0) {
      uVar5 = uVar6 >> 1;
    }
    uVar6 = (ulong)((uint)(uVar5 >> 1) ^ 0x82f63b78);
    if ((uVar5 & 1) == 0) {
      uVar6 = uVar5 >> 1;
    }
    uVar4 = (uint)(uVar6 >> 1);
    uVar8 = uVar4 ^ 0x82f63b78;
    if ((uVar6 & 1) == 0) {
      uVar8 = uVar4;
    }
    p_crc32c->table[0][uVar1] = uVar8;
  }
  puVar3 = (uint32_t *)p_crc32c;
  for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 1) {
    uVar4 = p_crc32c->table[0][lVar2];
    for (lVar7 = 0x400; lVar7 != 0x2000; lVar7 = lVar7 + 0x400) {
      uVar4 = uVar4 >> 8 ^ p_crc32c->table[0][uVar4 & 0xff];
      *(uint *)((long)puVar3 + lVar7) = uVar4;
    }
    puVar3 = puVar3 + 1;
  }
  return;
}

Assistant:

void av1_crc32c_calculator_init(CRC32C *p_crc32c) {
  uint32_t crc;

  for (int n = 0; n < 256; n++) {
    crc = n;
    crc = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
    crc = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
    crc = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
    crc = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
    crc = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
    crc = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
    crc = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
    crc = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
    p_crc32c->table[0][n] = crc;
  }
  for (int n = 0; n < 256; n++) {
    crc = p_crc32c->table[0][n];
    for (int k = 1; k < 8; k++) {
      crc = p_crc32c->table[0][crc & 0xff] ^ (crc >> 8);
      p_crc32c->table[k][n] = crc;
    }
  }
}